

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_5db41::Pools::~Pools(Pools *this)

{
  pointer ppuVar1;
  uchar *puVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppuVar1 = (this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->chunks_).
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppuVar1 >> 3) <= (ulong)uVar3)
    break;
    puVar2 = ppuVar1[uVar3];
    if (puVar2 != (uchar *)0x0) {
      operator_delete__(puVar2);
    }
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&(this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)
  ;
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)this);
  return;
}

Assistant:

~Pools() {
            for(index_t i=0; i<chunks_.size(); ++i) {
                delete[] chunks_[i];
            }
        }